

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest07KeyUsage_::
DISABLED_Section7InvalidkeyUsageCriticalcRLSignFalseTest4<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::~DISABLED_Section7InvalidkeyUsageCriticalcRLSignFalseTest4
          (DISABLED_Section7InvalidkeyUsageCriticalcRLSignFalseTest4<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  DISABLED_Section7InvalidkeyUsageCriticalcRLSignFalseTest4<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
  *this_local;
  
  ~DISABLED_Section7InvalidkeyUsageCriticalcRLSignFalseTest4(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest07KeyUsage,
                     Section7InvalidkeyUsageCriticalcRLSignFalseTest4) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "keyUsageCriticalcRLSignFalseCACert",
                               "InvalidkeyUsageCriticalcRLSignFalseTest4EE"};
  const char* const crls[] = {"TrustAnchorRootCRL",
                              "keyUsageCriticalcRLSignFalseCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.7.4";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}